

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O0

_Bool Hacl_Impl_Ed25519_PointDecompress_point_decompress(uint64_t *out,uint8_t *s)

{
  _Bool _Var1;
  uint64_t *puVar2;
  uint64_t *__dest;
  uint64_t *b;
  uint64_t *in_RDI;
  uint64_t one1;
  uint64_t zero1;
  uint64_t *outt;
  uint64_t *outz;
  uint64_t *outy;
  uint64_t *outx;
  _Bool res;
  _Bool z0;
  _Bool z;
  uint64_t sign1;
  uint8_t s31;
  uint64_t *x;
  uint64_t *y;
  uint64_t *x0;
  uint64_t *y0;
  uint64_t tmp [10];
  uint64_t *in_stack_ffffffffffffff28;
  uint64_t *in_stack_ffffffffffffff30;
  undefined1 local_68 [40];
  undefined1 auStack_40 [16];
  uint64_t in_stack_ffffffffffffffd0;
  uint64_t *in_stack_ffffffffffffffd8;
  uint64_t *in_stack_ffffffffffffffe0;
  
  memset(local_68,0,0x50);
  Hacl_Impl_Load51_load_51(in_stack_ffffffffffffff30,(uint8_t *)in_stack_ffffffffffffff28);
  _Var1 = Hacl_Impl_Ed25519_RecoverX_recover_x
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (_Var1) {
    puVar2 = Hacl_Impl_Ed25519_ExtPoint_getx(in_RDI);
    __dest = Hacl_Impl_Ed25519_ExtPoint_gety(in_RDI);
    b = Hacl_Impl_Ed25519_ExtPoint_getz(in_RDI);
    Hacl_Impl_Ed25519_ExtPoint_gett(in_RDI);
    memcpy(puVar2,auStack_40,0x28);
    memcpy(__dest,local_68,0x28);
    puVar2 = (uint64_t *)0x1;
    Hacl_Lib_Create64_make_h64_5(b,1,0,0,0,0);
    Hacl_Bignum25519_fmul(puVar2,in_stack_ffffffffffffff28,(uint64_t *)0x11212d);
  }
  return _Var1;
}

Assistant:

static bool Hacl_Impl_Ed25519_PointDecompress_point_decompress(uint64_t *out, uint8_t *s)
{
  uint64_t tmp[10U] = { 0U };
  uint64_t *y0 = tmp;
  uint64_t *x0 = tmp + (uint32_t)5U;
  uint64_t *y = tmp;
  uint64_t *x = tmp + (uint32_t)5U;
  uint8_t s31 = s[31U];
  uint64_t sign1 = (uint64_t)(s31 >> (uint32_t)7U);
  Hacl_Impl_Load51_load_51(y, s);
  bool z = Hacl_Impl_Ed25519_RecoverX_recover_x(x, y, sign1);
  bool z0 = z;
  bool res;
  if (z0 == false)
    res = false;
  else
  {
    uint64_t *outx = Hacl_Impl_Ed25519_ExtPoint_getx(out);
    uint64_t *outy = Hacl_Impl_Ed25519_ExtPoint_gety(out);
    uint64_t *outz = Hacl_Impl_Ed25519_ExtPoint_getz(out);
    uint64_t *outt = Hacl_Impl_Ed25519_ExtPoint_gett(out);
    memcpy(outx, x0, (uint32_t)5U * sizeof x0[0U]);
    memcpy(outy, y0, (uint32_t)5U * sizeof y0[0U]);
    uint64_t zero1 = (uint64_t)0U;
    uint64_t one1 = (uint64_t)1U;
    Hacl_Lib_Create64_make_h64_5(outz, one1, zero1, zero1, zero1, zero1);
    Hacl_Bignum25519_fmul(outt, x0, y0);
    res = true;
  }
  return res;
}